

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

bool __thiscall
deqp::gles2::Performance::ShaderCompilerCase::compileShader
          (ShaderCompilerCase *this,deUint32 shader)

{
  int iVar1;
  undefined4 extraout_var;
  GLint status;
  int local_1c;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1c = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x248))(shader);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa70))(shader,0x8b81,&local_1c);
  return local_1c != 0;
}

Assistant:

bool ShaderCompilerCase::compileShader (deUint32 shader) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	GLint status = 0;
	gl.compileShader(shader);
	gl.getShaderiv(shader, GL_COMPILE_STATUS, &status);
	return status != 0;
}